

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

lua_Number lua_tonumberx(lua_State *L,int idx,int *pisnum)

{
  int iVar1;
  TValue *obj;
  lua_Number n;
  
  n = 0.0;
  obj = index2value(L,idx);
  if (obj->tt_ == '\x13') {
    n = (obj->value_).n;
    iVar1 = 1;
  }
  else {
    iVar1 = luaV_tonumber_(obj,&n);
  }
  if (pisnum != (int *)0x0) {
    *pisnum = iVar1;
  }
  return n;
}

Assistant:

LUA_API lua_Number lua_tonumberx (lua_State *L, int idx, int *pisnum) {
  lua_Number n = 0;
  const TValue *o = index2value(L, idx);
  int isnum = tonumber(o, &n);
  if (pisnum)
    *pisnum = isnum;
  return n;
}